

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modinv64_impl.h
# Opt level: O1

void secp256k1_modinv64(secp256k1_modinv64_signed62 *x,secp256k1_modinv64_modinfo *modinfo)

{
  int iVar1;
  ulong uVar2;
  secp256k1_modinv64_signed62 *a;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  secp256k1_modinv64_signed62 *psVar10;
  secp256k1_modinv64_signed62 *psVar11;
  secp256k1_modinv64_signed62 *psVar12;
  secp256k1_modinv64_signed62 *a_00;
  long lVar13;
  ulong uVar14;
  long lVar15;
  uint uVar16;
  ulong uVar17;
  ulong uVar18;
  long lVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  bool bVar23;
  secp256k1_modinv64_signed62 f;
  uint64_t c1;
  secp256k1_modinv64_signed62 g;
  secp256k1_modinv64_trans2x2 t;
  secp256k1_modinv64_signed62 d;
  secp256k1_modinv64_signed62 e;
  secp256k1_modinv64_signed62 *local_190;
  secp256k1_modinv64_signed62 *local_188;
  ulong local_170;
  ulong local_168;
  ulong local_160;
  ulong local_158;
  ulong local_150;
  secp256k1_modinv64_signed62 local_148;
  secp256k1_modinv64_signed62 *local_118;
  ulong local_110;
  ulong local_108;
  ulong local_100;
  ulong local_f8;
  secp256k1_modinv64_signed62 *local_f0;
  ulong local_e8;
  secp256k1_modinv64_signed62 *local_e0;
  secp256k1_modinv64_signed62 local_d8;
  secp256k1_modinv64_trans2x2 local_a8;
  secp256k1_modinv64_signed62 local_88;
  secp256k1_modinv64_signed62 local_58;
  
  uVar5 = 0;
  local_88.v[2] = 0;
  local_88.v[3] = 0;
  local_88.v[0] = 0;
  local_88.v[1] = 0;
  local_88.v[4] = 0;
  local_58.v[1] = 0;
  local_58.v[4] = 0;
  local_58.v[2] = 0;
  local_58.v[3] = 0;
  local_58.v[0] = 1;
  local_148.v[4] = (modinfo->modulus).v[4];
  local_148.v[0] = (modinfo->modulus).v[0];
  local_158 = (modinfo->modulus).v[1];
  local_160 = (modinfo->modulus).v[2];
  local_148.v[3] = (modinfo->modulus).v[3];
  local_d8.v[0] = x->v[0];
  local_168 = x->v[1];
  local_170 = x->v[2];
  local_150 = x->v[3];
  uVar3 = x->v[4];
  uVar22 = 0xffffffffffffffff;
  uVar4 = local_148.v[0];
  uVar18 = local_d8.v[0];
  psVar11 = (secp256k1_modinv64_signed62 *)local_148.v[4];
  local_188 = (secp256k1_modinv64_signed62 *)local_148.v[3];
  local_148.v[1] = local_158;
  local_148.v[2] = local_160;
  local_118 = x;
  local_d8.v[1] = local_168;
  local_d8.v[2] = local_170;
  local_d8.v[3] = local_150;
  local_d8.v[4] = uVar3;
  do {
    uVar20 = 8;
    lVar6 = 3;
    uVar21 = 0;
    uVar17 = 0;
    psVar10 = (secp256k1_modinv64_signed62 *)0x8;
    local_190 = (secp256k1_modinv64_signed62 *)0x8;
    uVar2 = uVar18;
    uVar7 = uVar4;
    do {
      local_100 = uVar5;
      local_f8 = uVar3;
      local_f0 = psVar11;
      if ((uVar7 & 1) == 0) {
        secp256k1_modinv64_cold_29();
LAB_00146478:
        secp256k1_modinv64_cold_1();
LAB_0014647d:
        secp256k1_modinv64_cold_2();
LAB_00146482:
        secp256k1_modinv64_cold_28();
        goto LAB_00146487;
      }
      x = (secp256k1_modinv64_signed62 *)(uVar21 * uVar18 + uVar20 * uVar4);
      psVar10 = (secp256k1_modinv64_signed62 *)(uVar7 << ((byte)lVar6 & 0x3f));
      if (x != psVar10) goto LAB_00146478;
      x = (secp256k1_modinv64_signed62 *)((long)local_190 * uVar18 + uVar17 * uVar4);
      psVar10 = (secp256k1_modinv64_signed62 *)(uVar2 << ((byte)lVar6 & 0x3f));
      if (x != psVar10) goto LAB_0014647d;
      psVar10 = (secp256k1_modinv64_signed62 *)((long)uVar22 >> 0x3f);
      local_e8 = (ulong)((uint)uVar2 & 1);
      uVar14 = -local_e8;
      x = (secp256k1_modinv64_signed62 *)((ulong)psVar10 & uVar14);
      local_e0 = psVar10;
      if ((uVar22 ^ (ulong)x) - 0x251 < 0xfffffffffffffb61) goto LAB_00146482;
      uVar22 = (uVar22 ^ (ulong)x) - 1;
      local_190 = (secp256k1_modinv64_signed62 *)
                  ((long)local_190->v + (((ulong)psVar10 ^ uVar21) - (long)psVar10 & uVar14));
      uVar21 = (uVar21 + ((ulong)local_190 & (ulong)x)) * 2;
      uVar17 = uVar17 + (((ulong)psVar10 ^ uVar20) - (long)psVar10 & uVar14);
      uVar20 = (uVar20 + (uVar17 & (ulong)x)) * 2;
      uVar14 = (((ulong)psVar10 ^ uVar7) - (long)psVar10 & uVar14) + uVar2;
      uVar2 = uVar14 >> 1;
      uVar7 = uVar7 + (uVar14 & (ulong)x);
      lVar6 = lVar6 + 1;
    } while (lVar6 != 0x3e);
    psVar10 = (secp256k1_modinv64_signed62 *)(uVar21 * uVar17);
    x = local_190;
    local_a8.u = uVar20;
    local_a8.v = uVar21;
    local_a8.q = uVar17;
    local_a8.r = (int64_t)local_190;
    if ((SUB168(SEXT816((long)uVar20) * SEXT816((long)local_190),8) -
        SUB168(SEXT816((long)uVar21) * SEXT816((long)uVar17),8)) -
        (ulong)((secp256k1_modinv64_signed62 *)(uVar20 * (long)local_190) < psVar10) != 2 ||
        (long)(uVar20 * (long)local_190) - (long)psVar10 != 0) {
LAB_00146487:
      secp256k1_modinv64_cold_3();
LAB_0014648c:
      secp256k1_modinv64_cold_27();
LAB_00146491:
      secp256k1_modinv64_cold_26();
LAB_00146496:
      a = x;
      secp256k1_modinv64_cold_25();
LAB_0014649b:
      secp256k1_modinv64_cold_24();
LAB_001464a0:
      secp256k1_modinv64_cold_4();
LAB_001464a5:
      secp256k1_modinv64_cold_5();
LAB_001464aa:
      secp256k1_modinv64_cold_6();
LAB_001464af:
      secp256k1_modinv64_cold_7();
LAB_001464b4:
      secp256k1_modinv64_cold_8();
LAB_001464b9:
      secp256k1_modinv64_cold_9();
LAB_001464be:
      secp256k1_modinv64_cold_10();
LAB_001464c3:
      secp256k1_modinv64_cold_11();
LAB_001464c8:
      secp256k1_modinv64_cold_12();
LAB_001464cd:
      secp256k1_modinv64_cold_13();
LAB_001464d2:
      secp256k1_modinv64_cold_14();
LAB_001464d7:
      secp256k1_modinv64_cold_15();
LAB_001464dc:
      secp256k1_modinv64_cold_23();
      psVar11 = psVar10;
LAB_001464e1:
      secp256k1_modinv64_cold_22();
      psVar12 = a;
LAB_001464e6:
      a_00 = psVar12;
      secp256k1_modinv64_cold_21();
LAB_001464eb:
      secp256k1_modinv64_cold_20();
LAB_001464f0:
      x = a_00;
      secp256k1_modinv64_cold_19();
LAB_001464f5:
      secp256k1_modinv64_cold_18();
      goto LAB_001464fa;
    }
    secp256k1_modinv64_update_de_62(&local_88,&local_58,&local_a8,modinfo);
    x = &local_148;
    psVar10 = (secp256k1_modinv64_signed62 *)0x5;
    iVar1 = secp256k1_modinv64_mul_cmp_62(x,5,&modinfo->modulus,-1);
    if (iVar1 < 1) goto LAB_0014648c;
    x = &local_148;
    psVar10 = (secp256k1_modinv64_signed62 *)0x5;
    iVar1 = secp256k1_modinv64_mul_cmp_62(x,5,&modinfo->modulus,1);
    if (0 < iVar1) goto LAB_00146491;
    a = &local_d8;
    psVar10 = (secp256k1_modinv64_signed62 *)0x5;
    x = a;
    iVar1 = secp256k1_modinv64_mul_cmp_62(a,5,&modinfo->modulus,-1);
    if (iVar1 < 1) goto LAB_00146496;
    psVar10 = (secp256k1_modinv64_signed62 *)0x5;
    iVar1 = secp256k1_modinv64_mul_cmp_62(a,5,&modinfo->modulus,1);
    if (-1 < iVar1) goto LAB_0014649b;
    a = (secp256k1_modinv64_signed62 *)(uVar20 * uVar4);
    psVar10 = SUB168(SEXT816((long)uVar20) * SEXT816((long)uVar4),8);
    uVar3 = uVar21 * uVar18;
    lVar6 = SUB168(SEXT816((long)uVar21) * SEXT816((long)uVar18),8);
    if ((-1 < lVar6) &&
       (uVar5 = (ulong)((secp256k1_modinv64_signed62 *)(-1 - uVar3) < a),
       lVar8 = (0x7fffffffffffffff - lVar6) - (long)psVar10,
       (SBORROW8(0x7fffffffffffffff - lVar6,(long)psVar10) != SBORROW8(lVar8,uVar5)) !=
       (long)(lVar8 - uVar5) < 0)) goto LAB_001464a0;
    psVar11 = (secp256k1_modinv64_signed62 *)((long)a->v + uVar3);
    lVar6 = (long)psVar10->v + (ulong)CARRY8(uVar3,(ulong)a) + lVar6;
    a = (secp256k1_modinv64_signed62 *)(uVar17 * uVar4);
    psVar10 = SUB168(SEXT816((long)uVar17) * SEXT816((long)uVar4),8);
    uVar3 = (long)local_190 * uVar18;
    lVar8 = SUB168(SEXT816((long)local_190) * SEXT816((long)uVar18),8);
    if ((-1 < lVar8) &&
       (uVar4 = (ulong)((secp256k1_modinv64_signed62 *)(-1 - uVar3) < a),
       lVar9 = (0x7fffffffffffffff - lVar8) - (long)psVar10,
       (SBORROW8(0x7fffffffffffffff - lVar8,(long)psVar10) != SBORROW8(lVar9,uVar4)) !=
       (long)(lVar9 - uVar4) < 0)) goto LAB_001464a5;
    bVar23 = CARRY8((ulong)a,uVar3);
    a = (secp256k1_modinv64_signed62 *)((long)a->v + uVar3);
    psVar10 = (secp256k1_modinv64_signed62 *)((long)psVar10->v + (ulong)bVar23 + lVar8);
    if (((ulong)psVar11 & 0x3ffffffffffffffe) != 0) goto LAB_001464aa;
    if (((ulong)a & 0x3fffffffffffffff) != 0) goto LAB_001464af;
    uVar3 = (ulong)psVar11 >> 0x3e | lVar6 * 4;
    uVar18 = local_158 * uVar20 + uVar3;
    lVar13 = SUB168(SEXT816((long)local_158) * SEXT816((long)uVar20),8) + (lVar6 >> 0x3e) +
             (ulong)CARRY8(local_158 * uVar20,uVar3);
    uVar4 = local_168 * uVar21;
    lVar9 = SUB168(SEXT816((long)local_168) * SEXT816((long)uVar21),8);
    uVar3 = (ulong)(-uVar4 - 1 < uVar18);
    lVar6 = (0x7fffffffffffffff - lVar9) - lVar13;
    lVar15 = (-0x8000000000000000 - lVar9) - (ulong)(uVar4 != 0);
    lVar8 = lVar13 - lVar15;
    bVar23 = (SBORROW8(0x7fffffffffffffff - lVar9,lVar13) != SBORROW8(lVar6,uVar3)) ==
             (long)(lVar6 - uVar3) < 0;
    if (lVar9 < 0) {
      bVar23 = (SBORROW8(lVar13,lVar15) != SBORROW8(lVar8,(ulong)(uVar18 < -uVar4))) ==
               (long)(lVar8 - (ulong)(uVar18 < -uVar4)) < 0;
    }
    if (!bVar23) goto LAB_001464b4;
    uVar3 = (ulong)a >> 0x3e | (long)psVar10 * 4;
    uVar2 = local_158 * uVar17 + uVar3;
    lVar8 = SUB168(SEXT816((long)local_158) * SEXT816((long)uVar17),8) + ((long)psVar10 >> 0x3e) +
            (ulong)CARRY8(local_158 * uVar17,uVar3);
    uVar5 = local_168 * (long)local_190;
    a = SUB168(SEXT816((long)local_168) * SEXT816((long)local_190),8);
    uVar3 = (ulong)(-uVar5 - 1 < uVar2);
    lVar6 = (0x7fffffffffffffff - (long)a) - lVar8;
    psVar10 = (secp256k1_modinv64_signed62 *)((-0x8000000000000000 - (long)a) - (ulong)(uVar5 != 0))
    ;
    bVar23 = (SBORROW8(0x7fffffffffffffff - (long)a,lVar8) != SBORROW8(lVar6,uVar3)) ==
             (long)(lVar6 - uVar3) < 0;
    if ((long)a < 0) {
      bVar23 = (SBORROW8(lVar8,(long)psVar10) !=
               SBORROW8(lVar8 - (long)psVar10,(ulong)(uVar2 < -uVar5))) ==
               (long)((lVar8 - (long)psVar10) - (ulong)(uVar2 < -uVar5)) < 0;
    }
    if (!bVar23) goto LAB_001464b9;
    lVar6 = lVar9 + lVar13 + (ulong)CARRY8(uVar4,uVar18);
    a = (secp256k1_modinv64_signed62 *)((long)a->v + (ulong)CARRY8(uVar5,uVar2) + lVar8);
    uVar3 = lVar6 * 4 | uVar4 + uVar18 >> 0x3e;
    local_148.v[0] = uVar4 + uVar18 & 0x3fffffffffffffff;
    local_108 = uVar5 + uVar2 & 0x3fffffffffffffff;
    uVar18 = local_160 * uVar20 + uVar3;
    lVar8 = (lVar6 >> 0x3e) + SUB168(SEXT816((long)local_160) * SEXT816((long)uVar20),8) +
            (ulong)CARRY8(local_160 * uVar20,uVar3);
    uVar4 = local_170 * uVar21;
    lVar9 = SUB168(SEXT816((long)local_170) * SEXT816((long)uVar21),8);
    uVar3 = (ulong)(-uVar4 - 1 < uVar18);
    lVar6 = (0x7fffffffffffffff - lVar9) - lVar8;
    psVar10 = (secp256k1_modinv64_signed62 *)((-0x8000000000000000 - lVar9) - (ulong)(uVar4 != 0));
    bVar23 = (SBORROW8(0x7fffffffffffffff - lVar9,lVar8) != SBORROW8(lVar6,uVar3)) ==
             (long)(lVar6 - uVar3) < 0;
    if (lVar9 < 0) {
      bVar23 = (SBORROW8(lVar8,(long)psVar10) !=
               SBORROW8(lVar8 - (long)psVar10,(ulong)(uVar18 < -uVar4))) ==
               (long)((lVar8 - (long)psVar10) - (ulong)(uVar18 < -uVar4)) < 0;
    }
    local_d8.v[0] = local_108;
    if (!bVar23) goto LAB_001464be;
    uVar3 = uVar5 + uVar2 >> 0x3e | (long)a * 4;
    uVar2 = local_160 * uVar17 + uVar3;
    psVar10 = (secp256k1_modinv64_signed62 *)
              (SUB168(SEXT816((long)local_160) * SEXT816((long)uVar17),8) + ((long)a >> 0x3e) +
              (ulong)CARRY8(local_160 * uVar17,uVar3));
    uVar5 = local_170 * (long)local_190;
    lVar15 = SUB168(SEXT816((long)local_170) * SEXT816((long)local_190),8);
    uVar3 = (ulong)(-uVar5 - 1 < uVar2);
    lVar6 = (0x7fffffffffffffff - lVar15) - (long)psVar10;
    lVar19 = (-0x8000000000000000 - lVar15) - (ulong)(uVar5 != 0);
    lVar13 = (long)psVar10 - lVar19;
    bVar23 = (SBORROW8(0x7fffffffffffffff - lVar15,(long)psVar10) != SBORROW8(lVar6,uVar3)) ==
             (long)(lVar6 - uVar3) < 0;
    if (lVar15 < 0) {
      bVar23 = (SBORROW8((long)psVar10,lVar19) != SBORROW8(lVar13,(ulong)(uVar2 < -uVar5))) ==
               (long)(lVar13 - (ulong)(uVar2 < -uVar5)) < 0;
    }
    a = (secp256k1_modinv64_signed62 *)(ulong)bVar23;
    local_110 = local_148.v[0];
    if (bVar23 == false) goto LAB_001464c3;
    lVar6 = lVar8 + lVar9 + (ulong)CARRY8(uVar18,uVar4);
    psVar10 = (secp256k1_modinv64_signed62 *)
              ((long)psVar10->v + (ulong)CARRY8(uVar2,uVar5) + lVar15);
    uVar3 = lVar6 * 4 | uVar18 + uVar4 >> 0x3e;
    local_158 = uVar18 + uVar4 & 0x3fffffffffffffff;
    local_168 = uVar2 + uVar5 & 0x3fffffffffffffff;
    uVar18 = (long)local_188 * uVar20 + uVar3;
    lVar8 = (lVar6 >> 0x3e) + SUB168(SEXT816((long)local_188) * SEXT816((long)uVar20),8) +
            (ulong)CARRY8((long)local_188 * uVar20,uVar3);
    uVar4 = local_150 * uVar21;
    lVar9 = SUB168(SEXT816((long)local_150) * SEXT816((long)uVar21),8);
    uVar3 = (ulong)(-uVar4 - 1 < uVar18);
    lVar6 = (0x7fffffffffffffff - lVar9) - lVar8;
    a = (secp256k1_modinv64_signed62 *)((-0x8000000000000000 - lVar9) - (ulong)(uVar4 != 0));
    bVar23 = (SBORROW8(0x7fffffffffffffff - lVar9,lVar8) != SBORROW8(lVar6,uVar3)) ==
             (long)(lVar6 - uVar3) < 0;
    if (lVar9 < 0) {
      bVar23 = (SBORROW8(lVar8,(long)a) != SBORROW8(lVar8 - (long)a,(ulong)(uVar18 < -uVar4))) ==
               (long)((lVar8 - (long)a) - (ulong)(uVar18 < -uVar4)) < 0;
    }
    local_148.v[1] = local_158;
    local_d8.v[1] = local_168;
    if (!bVar23) goto LAB_001464c8;
    uVar3 = uVar2 + uVar5 >> 0x3e | (long)psVar10 * 4;
    uVar2 = (long)local_188 * uVar17 + uVar3;
    a = (secp256k1_modinv64_signed62 *)
        (SUB168(SEXT816((long)local_188) * SEXT816((long)uVar17),8) + ((long)psVar10 >> 0x3e) +
        (ulong)CARRY8((long)local_188 * uVar17,uVar3));
    uVar5 = local_150 * (long)local_190;
    lVar15 = SUB168(SEXT816((long)local_150) * SEXT816((long)local_190),8);
    uVar3 = (ulong)(-uVar5 - 1 < uVar2);
    lVar6 = (0x7fffffffffffffff - lVar15) - (long)a;
    lVar19 = (-0x8000000000000000 - lVar15) - (ulong)(uVar5 != 0);
    lVar13 = (long)a - lVar19;
    bVar23 = (SBORROW8(0x7fffffffffffffff - lVar15,(long)a) != SBORROW8(lVar6,uVar3)) ==
             (long)(lVar6 - uVar3) < 0;
    if (lVar15 < 0) {
      bVar23 = (SBORROW8((long)a,lVar19) != SBORROW8(lVar13,(ulong)(uVar2 < -uVar5))) ==
               (long)(lVar13 - (ulong)(uVar2 < -uVar5)) < 0;
    }
    psVar10 = (secp256k1_modinv64_signed62 *)(ulong)bVar23;
    if (bVar23 == false) goto LAB_001464cd;
    lVar6 = lVar8 + lVar9 + (ulong)CARRY8(uVar18,uVar4);
    a = (secp256k1_modinv64_signed62 *)((long)a->v + (ulong)CARRY8(uVar2,uVar5) + lVar15);
    uVar3 = lVar6 * 4 | uVar18 + uVar4 >> 0x3e;
    local_160 = uVar18 + uVar4 & 0x3fffffffffffffff;
    local_170 = uVar2 + uVar5 & 0x3fffffffffffffff;
    uVar18 = (long)local_f0 * uVar20 + uVar3;
    lVar9 = (lVar6 >> 0x3e) + SUB168(SEXT816((long)local_f0) * SEXT816((long)uVar20),8) +
            (ulong)CARRY8((long)local_f0 * uVar20,uVar3);
    uVar4 = local_f8 * uVar21;
    psVar10 = SUB168(SEXT816((long)local_f8) * SEXT816((long)uVar21),8);
    uVar3 = (ulong)(-uVar4 - 1 < uVar18);
    lVar6 = (0x7fffffffffffffff - (long)psVar10) - lVar9;
    lVar13 = (-0x8000000000000000 - (long)psVar10) - (ulong)(uVar4 != 0);
    lVar8 = lVar9 - lVar13;
    bVar23 = (SBORROW8(0x7fffffffffffffff - (long)psVar10,lVar9) != SBORROW8(lVar6,uVar3)) ==
             (long)(lVar6 - uVar3) < 0;
    if ((long)psVar10 < 0) {
      bVar23 = (SBORROW8(lVar9,lVar13) != SBORROW8(lVar8,(ulong)(uVar18 < -uVar4))) ==
               (long)(lVar8 - (ulong)(uVar18 < -uVar4)) < 0;
    }
    local_148.v[2] = local_160;
    local_d8.v[2] = local_170;
    if (!bVar23) goto LAB_001464d2;
    uVar3 = uVar2 + uVar5 >> 0x3e | (long)a * 4;
    uVar21 = (long)local_f0 * uVar17 + uVar3;
    lVar15 = SUB168(SEXT816((long)local_f0) * SEXT816((long)uVar17),8) + ((long)a >> 0x3e) +
             (ulong)CARRY8((long)local_f0 * uVar17,uVar3);
    uVar5 = local_f8 * (long)local_190;
    lVar13 = SUB168(SEXT816((long)local_f8) * SEXT816((long)local_190),8);
    uVar3 = (ulong)(-uVar5 - 1 < uVar21);
    lVar6 = (0x7fffffffffffffff - lVar13) - lVar15;
    lVar19 = (-0x8000000000000000 - lVar13) - (ulong)(uVar5 != 0);
    lVar8 = lVar15 - lVar19;
    bVar23 = (SBORROW8(0x7fffffffffffffff - lVar13,lVar15) != SBORROW8(lVar6,uVar3)) ==
             (long)(lVar6 - uVar3) < 0;
    if (lVar13 < 0) {
      bVar23 = (SBORROW8(lVar15,lVar19) != SBORROW8(lVar8,(ulong)(uVar21 < -uVar5))) ==
               (long)(lVar8 - (ulong)(uVar21 < -uVar5)) < 0;
    }
    a = (secp256k1_modinv64_signed62 *)(ulong)bVar23;
    if (bVar23 == false) goto LAB_001464d7;
    lVar6 = (long)psVar10->v + (ulong)CARRY8(uVar18,uVar4) + lVar9;
    lVar8 = lVar15 + lVar13 + (ulong)CARRY8(uVar21,uVar5);
    psVar10 = (secp256k1_modinv64_signed62 *)(lVar6 * 4 | uVar18 + uVar4 >> 0x3e);
    a = (secp256k1_modinv64_signed62 *)(uVar18 + uVar4 & 0x3fffffffffffffff);
    local_150 = uVar21 + uVar5 & 0x3fffffffffffffff;
    local_148.v[3] = (int64_t)a;
    local_d8.v[3] = local_150;
    if ((lVar6 >> 0x3e) + -1 + (ulong)((secp256k1_modinv64_signed62 *)0x7fffffffffffffff < psVar10)
        != -1) goto LAB_001464dc;
    uVar3 = uVar21 + uVar5 >> 0x3e | lVar8 * 4;
    psVar11 = psVar10;
    local_148.v[4] = (int64_t)psVar10;
    if ((lVar8 >> 0x3e) + -1 + (ulong)(0x7fffffffffffffff < uVar3) != -1) goto LAB_001464e1;
    a_00 = &local_148;
    psVar11 = (secp256k1_modinv64_signed62 *)0x5;
    psVar12 = a_00;
    local_d8.v[4] = uVar3;
    iVar1 = secp256k1_modinv64_mul_cmp_62(a_00,5,&modinfo->modulus,-1);
    if (iVar1 < 1) goto LAB_001464e6;
    psVar11 = (secp256k1_modinv64_signed62 *)0x5;
    iVar1 = secp256k1_modinv64_mul_cmp_62(a_00,5,&modinfo->modulus,1);
    if (0 < iVar1) goto LAB_001464eb;
    x = &local_d8;
    psVar11 = (secp256k1_modinv64_signed62 *)0x5;
    a_00 = x;
    iVar1 = secp256k1_modinv64_mul_cmp_62(x,5,&modinfo->modulus,-1);
    if (iVar1 < 1) goto LAB_001464f0;
    psVar11 = (secp256k1_modinv64_signed62 *)0x5;
    iVar1 = secp256k1_modinv64_mul_cmp_62(x,5,&modinfo->modulus,1);
    if (-1 < iVar1) goto LAB_001464f5;
    uVar16 = (int)local_100 + 1;
    uVar5 = (ulong)uVar16;
    uVar4 = local_110;
    uVar18 = local_108;
    psVar11 = psVar10;
    local_188 = a;
  } while (uVar16 != 10);
  x = &local_d8;
  psVar11 = (secp256k1_modinv64_signed62 *)0x5;
  iVar1 = secp256k1_modinv64_mul_cmp_62(x,5,&SECP256K1_SIGNED62_ONE,0);
  if (iVar1 == 0) {
    iVar1 = secp256k1_modinv64_mul_cmp_62(&local_148,5,&SECP256K1_SIGNED62_ONE,-1);
    psVar10 = local_118;
    if (iVar1 != 0) {
      iVar1 = secp256k1_modinv64_mul_cmp_62(&local_148,5,&SECP256K1_SIGNED62_ONE,1);
      if (iVar1 != 0) {
        psVar11 = (secp256k1_modinv64_signed62 *)0x5;
        x = psVar10;
        iVar1 = secp256k1_modinv64_mul_cmp_62(psVar10,5,&SECP256K1_SIGNED62_ONE,0);
        if (iVar1 == 0) {
          x = &local_88;
          psVar11 = (secp256k1_modinv64_signed62 *)0x5;
          iVar1 = secp256k1_modinv64_mul_cmp_62(x,5,&SECP256K1_SIGNED62_ONE,0);
          if (iVar1 == 0) {
            x = &local_148;
            psVar11 = (secp256k1_modinv64_signed62 *)0x5;
            iVar1 = secp256k1_modinv64_mul_cmp_62(x,5,&modinfo->modulus,1);
            if (iVar1 == 0) goto LAB_00146431;
          }
        }
        goto LAB_001464ff;
      }
    }
LAB_00146431:
    secp256k1_modinv64_normalize_62(&local_88,local_148.v[4],modinfo);
    *(int64_t *)((long)psVar10->v + 0x20) = local_88.v[4];
    *(int64_t *)((long)psVar10->v + 0x10) = local_88.v[2];
    *(int64_t *)((long)psVar10->v + 0x18) = local_88.v[3];
    psVar10->v[0] = local_88.v[0];
    *(int64_t *)((long)psVar10->v + 8) = local_88.v[1];
    return;
  }
LAB_001464fa:
  secp256k1_modinv64_cold_16();
LAB_001464ff:
  secp256k1_modinv64_cold_17();
  uVar5 = (ulong)((uint)psVar11->v[0] & 1);
  uVar22 = -uVar5;
  secp256k1_scalar_verify((secp256k1_scalar *)psVar11);
  uVar3 = psVar11->v[1] << 0x3f | (ulong)psVar11->v[0] >> 1;
  x->v[0] = uVar3 + (uVar22 & 0xdfe92f46681b20a1);
  uVar18 = psVar11->v[2] << 0x3f | (ulong)psVar11->v[1] >> 1;
  uVar3 = (ulong)CARRY8(uVar22 & 0xdfe92f46681b20a1,uVar3);
  uVar4 = (uVar22 & 0x5d576e7357a4501d) + uVar18;
  bVar23 = CARRY8(uVar22 & 0x5d576e7357a4501d,uVar18) || CARRY8(uVar4,uVar3);
  *(ulong *)((long)x->v + 8) = uVar4 + uVar3;
  uVar3 = psVar11->v[3] << 0x3f | (ulong)psVar11->v[2] >> 1;
  *(ulong *)((long)x->v + 0x10) = (uVar3 - uVar5) + (ulong)bVar23;
  *(ulong *)((long)x->v + 0x18) =
       (uVar22 & 0x7fffffffffffffff) + ((ulong)psVar11->v[3] >> 1) +
       (ulong)(CARRY8(uVar3,uVar22) || CARRY8(uVar3 + uVar22,(ulong)bVar23));
  secp256k1_scalar_verify((secp256k1_scalar *)x);
  return;
}

Assistant:

static void secp256k1_modinv64(secp256k1_modinv64_signed62 *x, const secp256k1_modinv64_modinfo *modinfo) {
    /* Start with d=0, e=1, f=modulus, g=x, zeta=-1. */
    secp256k1_modinv64_signed62 d = {{0, 0, 0, 0, 0}};
    secp256k1_modinv64_signed62 e = {{1, 0, 0, 0, 0}};
    secp256k1_modinv64_signed62 f = modinfo->modulus;
    secp256k1_modinv64_signed62 g = *x;
    int i;
    int64_t zeta = -1; /* zeta = -(delta+1/2); delta starts at 1/2. */

    /* Do 10 iterations of 59 divsteps each = 590 divsteps. This suffices for 256-bit inputs. */
    for (i = 0; i < 10; ++i) {
        /* Compute transition matrix and new zeta after 59 divsteps. */
        secp256k1_modinv64_trans2x2 t;
        zeta = secp256k1_modinv64_divsteps_59(zeta, f.v[0], g.v[0], &t);
        /* Update d,e using that transition matrix. */
        secp256k1_modinv64_update_de_62(&d, &e, &t, modinfo);
        /* Update f,g using that transition matrix. */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&f, 5, &modinfo->modulus, -1) > 0); /* f > -modulus */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&f, 5, &modinfo->modulus, 1) <= 0); /* f <= modulus */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&g, 5, &modinfo->modulus, -1) > 0); /* g > -modulus */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&g, 5, &modinfo->modulus, 1) < 0);  /* g <  modulus */

        secp256k1_modinv64_update_fg_62(&f, &g, &t);

        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&f, 5, &modinfo->modulus, -1) > 0); /* f > -modulus */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&f, 5, &modinfo->modulus, 1) <= 0); /* f <= modulus */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&g, 5, &modinfo->modulus, -1) > 0); /* g > -modulus */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&g, 5, &modinfo->modulus, 1) < 0);  /* g <  modulus */
    }

    /* At this point sufficient iterations have been performed that g must have reached 0
     * and (if g was not originally 0) f must now equal +/- GCD of the initial f, g
     * values i.e. +/- 1, and d now contains +/- the modular inverse. */

    /* g == 0 */
    VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&g, 5, &SECP256K1_SIGNED62_ONE, 0) == 0);
    /* |f| == 1, or (x == 0 and d == 0 and f == modulus) */
    VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&f, 5, &SECP256K1_SIGNED62_ONE, -1) == 0 ||
                 secp256k1_modinv64_mul_cmp_62(&f, 5, &SECP256K1_SIGNED62_ONE, 1) == 0 ||
                 (secp256k1_modinv64_mul_cmp_62(x, 5, &SECP256K1_SIGNED62_ONE, 0) == 0 &&
                  secp256k1_modinv64_mul_cmp_62(&d, 5, &SECP256K1_SIGNED62_ONE, 0) == 0 &&
                  secp256k1_modinv64_mul_cmp_62(&f, 5, &modinfo->modulus, 1) == 0));

    /* Optionally negate d, normalize to [0,modulus), and return it. */
    secp256k1_modinv64_normalize_62(&d, f.v[4], modinfo);
    *x = d;
}